

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O1

void com_df_set_edge_ver(com_map_t *map,int i_scu,com_ref_pic_t (*refp) [2],int pix_x,int scu_y,
                        int cuh,int edgecondition)

{
  short sVar1;
  short sVar2;
  s8 (*pasVar3) [2];
  u8 *puVar4;
  s8 (*pasVar5) [2];
  s16 (*paasVar6) [2] [2];
  ushort uVar7;
  long lVar8;
  long lVar9;
  byte bVar10;
  com_pic_t *pcVar11;
  com_pic_t *pcVar12;
  ushort uVar13;
  com_pic_t *pcVar14;
  int iVar15;
  com_pic_t *pcVar16;
  
  pasVar3 = map->map_refi;
  lVar8 = (long)(scu_y * i_scu + pix_x);
  if ((long)pasVar3[lVar8][0] < 0) {
    pcVar11 = (com_pic_t *)0x0;
  }
  else {
    pcVar11 = refp[pasVar3[lVar8][0]][0].pic;
  }
  if ((long)pasVar3[lVar8][1] < 0) {
    pcVar12 = (com_pic_t *)0x0;
  }
  else {
    pcVar12 = refp[pasVar3[lVar8][1]][1].pic;
  }
  if (cuh != 0) {
    puVar4 = map->map_edge;
    lVar9 = lVar8;
    do {
      bVar10 = 1;
      if (((byte)map->map_scu[lVar9 + -1] & 0x12) == 0) {
        pasVar5 = map->map_refi;
        if (pasVar3[lVar8] == pasVar5[lVar9 + -1]) {
          paasVar6 = map->map_mv;
          if (pasVar3[lVar8][0] < '\0') {
LAB_00113a5f:
            if (pasVar3[lVar8][1] < '\0') {
LAB_00113b82:
              bVar10 = 0;
            }
            else {
              iVar15 = (int)paasVar6[lVar9][1][0] - (int)paasVar6[lVar9 + -1][1][0];
              uVar7 = (ushort)iVar15;
              uVar13 = -uVar7;
              if (0 < iVar15) {
                uVar13 = uVar7;
              }
              if (uVar13 < 4) {
                sVar1 = paasVar6[lVar9][1][1];
                sVar2 = paasVar6[lVar9 + -1][1][1];
LAB_00113b6a:
                uVar7 = (ushort)((int)sVar1 - (int)sVar2);
                uVar13 = -uVar7;
                if (0 < (int)sVar1 - (int)sVar2) {
                  uVar13 = uVar7;
                }
                if (uVar13 < 4) goto LAB_00113b82;
              }
            }
          }
          else {
            iVar15 = (int)paasVar6[lVar9][0][0] - (int)paasVar6[lVar9 + -1][0][0];
            uVar7 = (ushort)iVar15;
            uVar13 = -uVar7;
            if (0 < iVar15) {
              uVar13 = uVar7;
            }
            if (uVar13 < 4) {
              iVar15 = (int)paasVar6[lVar9][0][1] - (int)paasVar6[lVar9 + -1][0][1];
              uVar7 = (ushort)iVar15;
              uVar13 = -uVar7;
              if (0 < iVar15) {
                uVar13 = uVar7;
              }
              if (uVar13 < 4) goto LAB_00113a5f;
            }
          }
        }
        else {
          if ((long)pasVar5[lVar9 + -1][0] < 0) {
            pcVar14 = (com_pic_t *)0x0;
          }
          else {
            pcVar14 = refp[pasVar5[lVar9 + -1][0]][0].pic;
          }
          if ((long)pasVar5[lVar9 + -1][1] < 0) {
            pcVar16 = (com_pic_t *)0x0;
          }
          else {
            pcVar16 = refp[pasVar5[lVar9 + -1][1]][1].pic;
          }
          if ((pcVar16 == pcVar11) && (pcVar14 == pcVar12)) {
            paasVar6 = map->map_mv;
            if (pasVar3[lVar8][0] < '\0') {
LAB_00113b33:
              if (-1 < pasVar3[lVar8][1]) {
                iVar15 = (int)paasVar6[lVar9][1][0] - (int)paasVar6[lVar9 + -1][0][0];
                uVar7 = (ushort)iVar15;
                uVar13 = -uVar7;
                if (0 < iVar15) {
                  uVar13 = uVar7;
                }
                if (3 < uVar13) goto LAB_001139ed;
                sVar1 = paasVar6[lVar9][1][1];
                sVar2 = paasVar6[lVar9 + -1][0][1];
                goto LAB_00113b6a;
              }
              goto LAB_00113b82;
            }
            iVar15 = (int)paasVar6[lVar9][0][0] - (int)paasVar6[lVar9 + -1][1][0];
            uVar7 = (ushort)iVar15;
            uVar13 = -uVar7;
            if (0 < iVar15) {
              uVar13 = uVar7;
            }
            if (uVar13 < 4) {
              iVar15 = (int)paasVar6[lVar9][0][1] - (int)paasVar6[lVar9 + -1][1][1];
              uVar7 = (ushort)iVar15;
              uVar13 = -uVar7;
              if (0 < iVar15) {
                uVar13 = uVar7;
              }
              if (uVar13 < 4) goto LAB_00113b33;
            }
          }
        }
      }
LAB_001139ed:
      puVar4[lVar9] = puVar4[lVar9] | bVar10;
      cuh = cuh + -1;
      lVar9 = lVar9 + i_scu;
    } while (cuh != 0);
  }
  return;
}

Assistant:

static void uavs3d_always_inline com_df_set_edge_ver_inline(com_map_t *map, int i_scu, com_ref_pic_t refp[MAX_REFS][REFP_NUM], int scu_x, int scu_y, int h, int edgecondition)
{
    int scup = scu_y * i_scu + scu_x;
    u8 *edge_filter = map->map_edge + scup;
    s8 *refi_p = map->map_refi[scup];
    com_pic_t *p_pic0 = REFI_IS_VALID(refi_p[REFP_0]) ? refp[refi_p[REFP_0]][REFP_0].pic : NULL;
    com_pic_t *p_pic1 = REFI_IS_VALID(refi_p[REFP_1]) ? refp[refi_p[REFP_1]][REFP_1].pic : NULL;

    while (h--) {
        *edge_filter |= skip_filter(map, refp, refi_p, p_pic0, p_pic1, scup, -1) ? 0 : edgecondition;
        edge_filter += i_scu;
        scup += i_scu;
    }
}